

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O1

mapped_type * __thiscall
eastl::
vector_map<char,_eastl::basic_string<char,_eastl::allocator>,_eastl::less<char>,_eastl::allocator>::
operator[](vector_map<char,_eastl::basic_string<char,_eastl::allocator>,_eastl::less<char>,_eastl::allocator>
           *this,key_type *key)

{
  pair<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>_*,_bool> pVar1;
  value_type local_30;
  
  local_30.first = *key;
  local_30.second.mpBegin = &gEmptyString;
  local_30.second.mpEnd = &gEmptyString;
  local_30.second.mpCapacity = &DAT_0010908d;
  gEmptyString = 0;
  pVar1 = insert(this,&local_30);
  if ((local_30.second.mpBegin != (value_type *)0x0) &&
     (1 < (long)local_30.second.mpCapacity - (long)local_30.second.mpBegin)) {
    operator_delete__(local_30.second.mpBegin);
  }
  return &(pVar1.first)->second;
}

Assistant:

::eastl::pair<iterator, iterator> equal_range(key_type const& k) {
    return ::eastl::equal_range(begin(), end(), k, m_cmp);
  }